

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

void __thiscall
LLVMBC::ExtractValueInst::ExtractValueInst
          (ExtractValueInst *this,Type *type,Value *aggregate,Vector<unsigned_int> *indices_)

{
  pointer puVar1;
  Value *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  Instruction::Instruction(&this->super_Instruction,type,ExtractValue);
  puVar1 = (indices_->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->indices).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->indices).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = puVar1;
  (this->indices).super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (indices_->super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_40 = aggregate;
  std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>::
  _M_range_initialize<LLVMBC::Value*const*>
            ((vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38,
             &local_40);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::_M_move_assign
            (&(this->super_Instruction).operands,
             (vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>> *)&local_38);
  std::_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
  ~_Vector_base((_Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)
                &local_38);
  return;
}

Assistant:

ExtractValueInst::ExtractValueInst(Type *type, Value *aggregate, Vector<unsigned> indices_)
    : Instruction(type, ValueKind::ExtractValue)
    , indices(std::move(indices_))
{
	set_operands({ aggregate });
}